

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalTree.h
# Opt level: O2

IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> * __thiscall
IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::operator=
          (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *this,intervalTree *other)

{
  _Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false> _Var1;
  _Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false> local_20;
  
  this->center = other->center;
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::operator=(&this->intervals,&other->intervals);
  if ((other->left)._M_t.
      super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      .super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>.
      _M_head_impl == (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0) {
    _Var1._M_head_impl = (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0;
  }
  else {
    copyTree((IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)&stack0xffffffffffffffe0,
             this);
    _Var1._M_head_impl = local_20._M_head_impl;
  }
  local_20._M_head_impl = (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0;
  std::
  __uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::reset((__uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           *)&this->left,_Var1._M_head_impl);
  std::
  unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                 *)&stack0xffffffffffffffe0);
  if ((other->right)._M_t.
      super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      .super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>.
      _M_head_impl == (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0) {
    _Var1._M_head_impl = (pointer)0x0;
  }
  else {
    copyTree((IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)&stack0xffffffffffffffe0,
             this);
    _Var1._M_head_impl = local_20._M_head_impl;
  }
  local_20._M_head_impl = (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0;
  std::
  __uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::reset((__uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           *)&this->right,_Var1._M_head_impl);
  std::
  unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                 *)&stack0xffffffffffffffe0);
  return this;
}

Assistant:

IntervalTree<T,K>& operator=(const intervalTree& other) {
        center = other.center;
        intervals = other.intervals;
        left = other.left ? copyTree(*other.left) : nullptr;
        right = other.right ? copyTree(*other.right) : nullptr;
        return *this;
    }